

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

UTF8Decoded decodeUTF8(StringRef Range)

{
  UTF8Decoded UVar1;
  int local_7c [2];
  pair<int,_int> local_74;
  int local_6c;
  pair<unsigned_int,_int> local_68;
  uint local_60 [2];
  uint32_t codepoint_2;
  uint local_50 [2];
  uint32_t codepoint_1;
  uint local_40 [2];
  uint32_t codepoint;
  iterator local_30;
  iterator End;
  iterator Position;
  StringRef Range_local;
  
  Range_local.Data = (char *)Range.Length;
  Position = Range.Data;
  End = llvm::StringRef::begin((StringRef *)&Position);
  local_30 = llvm::StringRef::end((StringRef *)&Position);
  if (((int)*End & 0x80U) == 0) {
    local_40[1] = 1;
    _codepoint = std::make_pair<char_const&,int>(End,(int *)(local_40 + 1));
    std::pair<unsigned_int,_unsigned_int>::pair<char,_int,_true>
              ((pair<unsigned_int,_unsigned_int> *)&Range_local.Length,(pair<char,_int> *)&codepoint
              );
  }
  else if ((((End + 1 == local_30) || (((int)*End & 0xe0U) != 0xc0)) ||
           (((int)End[1] & 0xc0U) != 0x80)) ||
          (local_40[0] = ((int)*End & 0x1fU) << 6 | (int)End[1] & 0x3fU, local_40[0] < 0x80)) {
    if ((((End + 2 == local_30) || (((int)*End & 0xf0U) != 0xe0)) ||
        ((((int)End[1] & 0xc0U) != 0x80 ||
         ((((int)End[2] & 0xc0U) != 0x80 ||
          (local_50[0] = ((int)*End & 0xfU) << 0xc | ((int)End[1] & 0x3fU) << 6 |
                         (int)End[2] & 0x3fU, local_50[0] < 0x800)))))) ||
       ((0xd7ff < local_50[0] && (local_50[0] < 0xe000)))) {
      if (((((End + 3 == local_30) || (((int)*End & 0xf8U) != 0xf0)) ||
           (((int)End[1] & 0xc0U) != 0x80)) ||
          ((((int)End[2] & 0xc0U) != 0x80 || (((int)End[3] & 0xc0U) != 0x80)))) ||
         ((local_60[0] = ((int)*End & 7U) << 0x12 | ((int)End[1] & 0x3fU) << 0xc |
                         ((int)End[2] & 0x3fU) << 6 | (int)End[3] & 0x3fU, local_60[0] < 0x10000 ||
          (0x10ffff < local_60[0])))) {
        local_7c[1] = 0;
        local_7c[0] = 0;
        local_74 = std::make_pair<int,int>(local_7c + 1,local_7c);
        std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
                  ((pair<unsigned_int,_unsigned_int> *)&Range_local.Length,&local_74);
      }
      else {
        local_6c = 4;
        local_68 = std::make_pair<unsigned_int&,int>(local_60,&local_6c);
        std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_int,_true>
                  ((pair<unsigned_int,_unsigned_int> *)&Range_local.Length,&local_68);
      }
    }
    else {
      local_60[1] = 3;
      _codepoint_2 = std::make_pair<unsigned_int&,int>(local_50,(int *)(local_60 + 1));
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_int,_true>
                ((pair<unsigned_int,_unsigned_int> *)&Range_local.Length,
                 (pair<unsigned_int,_int> *)&codepoint_2);
    }
  }
  else {
    local_50[1] = 2;
    _codepoint_1 = std::make_pair<unsigned_int&,int>(local_40,(int *)(local_50 + 1));
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_int,_true>
              ((pair<unsigned_int,_unsigned_int> *)&Range_local.Length,
               (pair<unsigned_int,_int> *)&codepoint_1);
  }
  UVar1.first = (undefined4)Range_local.Length;
  UVar1.second = Range_local.Length._4_4_;
  return UVar1;
}

Assistant:

static UTF8Decoded decodeUTF8(StringRef Range) {
  StringRef::iterator Position= Range.begin();
  StringRef::iterator End = Range.end();
  // 1 byte: [0x00, 0x7f]
  // Bit pattern: 0xxxxxxx
  if ((*Position & 0x80) == 0) {
     return std::make_pair(*Position, 1);
  }
  // 2 bytes: [0x80, 0x7ff]
  // Bit pattern: 110xxxxx 10xxxxxx
  if (Position + 1 != End &&
      ((*Position & 0xE0) == 0xC0) &&
      ((*(Position + 1) & 0xC0) == 0x80)) {
    uint32_t codepoint = ((*Position & 0x1F) << 6) |
                          (*(Position + 1) & 0x3F);
    if (codepoint >= 0x80)
      return std::make_pair(codepoint, 2);
  }
  // 3 bytes: [0x8000, 0xffff]
  // Bit pattern: 1110xxxx 10xxxxxx 10xxxxxx
  if (Position + 2 != End &&
      ((*Position & 0xF0) == 0xE0) &&
      ((*(Position + 1) & 0xC0) == 0x80) &&
      ((*(Position + 2) & 0xC0) == 0x80)) {
    uint32_t codepoint = ((*Position & 0x0F) << 12) |
                         ((*(Position + 1) & 0x3F) << 6) |
                          (*(Position + 2) & 0x3F);
    // Codepoints between 0xD800 and 0xDFFF are invalid, as
    // they are high / low surrogate halves used by UTF-16.
    if (codepoint >= 0x800 &&
        (codepoint < 0xD800 || codepoint > 0xDFFF))
      return std::make_pair(codepoint, 3);
  }
  // 4 bytes: [0x10000, 0x10FFFF]
  // Bit pattern: 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
  if (Position + 3 != End &&
      ((*Position & 0xF8) == 0xF0) &&
      ((*(Position + 1) & 0xC0) == 0x80) &&
      ((*(Position + 2) & 0xC0) == 0x80) &&
      ((*(Position + 3) & 0xC0) == 0x80)) {
    uint32_t codepoint = ((*Position & 0x07) << 18) |
                         ((*(Position + 1) & 0x3F) << 12) |
                         ((*(Position + 2) & 0x3F) << 6) |
                          (*(Position + 3) & 0x3F);
    if (codepoint >= 0x10000 && codepoint <= 0x10FFFF)
      return std::make_pair(codepoint, 4);
  }
  return std::make_pair(0, 0);
}